

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# com_table.c
# Opt level: O0

void com_dct_coef_init(void)

{
  ulong uVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double local_48;
  double v;
  double w0;
  int n;
  int k;
  double s;
  s8 *coeffs;
  double PI;
  int blk_size;
  int i;
  
  PI._0_4_ = 2;
  s = (double)g_tbl_itrans_coeffs;
  for (PI._4_4_ = 0; PI._4_4_ < 6; PI._4_4_ = PI._4_4_ + 1) {
    dVar2 = sqrt((double)PI._0_4_);
    dVar2 = dVar2 * 32.0;
    for (w0._4_4_ = 0; w0._4_4_ < PI._0_4_; w0._4_4_ = w0._4_4_ + 1) {
      for (w0._0_4_ = 0; w0._0_4_ < PI._0_4_; w0._0_4_ = w0._0_4_ + 1) {
        if (w0._4_4_ == 0) {
          local_48 = sqrt(0.5);
        }
        else {
          local_48 = 1.0;
        }
        dVar3 = cos((((double)w0._0_4_ + 0.5) * 3.141592653589793 * (double)w0._4_4_) /
                    (double)PI._0_4_);
        dVar4 = sqrt(2.0 / (double)PI._0_4_);
        dVar4 = dVar3 * local_48 * dVar4;
        uVar1 = -(ulong)(0.0 < dVar4);
        *(char *)((long)s + (long)(w0._4_4_ * PI._0_4_ + w0._0_4_)) =
             (char)(int)(dVar2 * dVar4 +
                        (double)(~uVar1 & 0xbfe0000000000000 | uVar1 & 0x3fe0000000000000));
        dVar3 = cos((((double)w0._4_4_ + 0.5) * 3.141592653589793 * ((double)w0._0_4_ + 0.5)) /
                    ((double)PI._0_4_ + 0.5));
        dVar4 = sqrt(2.0 / ((double)PI._0_4_ + 0.5));
        uVar1 = -(ulong)(0.0 < dVar3 * dVar4);
        *(char *)((long)s + (long)(PI._0_4_ * PI._0_4_ + w0._4_4_ * PI._0_4_ + w0._0_4_)) =
             (char)(int)(dVar2 * dVar3 * dVar4 +
                        (double)(~uVar1 & 0xbfe0000000000000 | uVar1 & 0x3fe0000000000000));
        dVar3 = sin((((double)w0._4_4_ + 0.5) * 3.141592653589793 * (double)(w0._0_4_ + 1)) /
                    ((double)PI._0_4_ + 0.5));
        dVar4 = sqrt(2.0 / ((double)PI._0_4_ + 0.5));
        uVar1 = -(ulong)(0.0 < dVar3 * dVar4);
        *(char *)((long)s + (long)(PI._0_4_ * 2 * PI._0_4_ + w0._4_4_ * PI._0_4_ + w0._0_4_)) =
             (char)(int)(dVar2 * dVar3 * dVar4 +
                        (double)(~uVar1 & 0xbfe0000000000000 | uVar1 & 0x3fe0000000000000));
      }
    }
    g_tbl_itrans[0][PI._4_4_] = (s8 *)s;
    g_tbl_itrans[1][PI._4_4_] = (s8 *)((long)s + (long)(PI._0_4_ * PI._0_4_));
    g_tbl_itrans[2][PI._4_4_] = (s8 *)((long)s + (long)(PI._0_4_ * 2 * PI._0_4_));
    s = (double)((long)s + (long)(PI._0_4_ * 3 * PI._0_4_));
    PI._0_4_ = PI._0_4_ << 1;
  }
  return;
}

Assistant:

void com_dct_coef_init()
{
    int i, blk_size = 2;
    const double PI = 3.14159265358979323846;
    s8 *coeffs = g_tbl_itrans_coeffs;

    for (i = 0; i < 6; i++) {
        const double s = sqrt((double)blk_size) * 32;

        for (int k = 0; k < blk_size; k++) {
            for (int n = 0; n < blk_size; n++) {
                double w0, v;
                
                // DCT2
                w0 = k == 0 ? sqrt(0.5) : 1;
                v = cos(PI * (n + 0.5) * k / blk_size) * w0 * sqrt(2.0 / blk_size);
                coeffs[DCT2 * blk_size * blk_size + k * blk_size + n] = (s8)(s * v + (v > 0 ? 0.5 : -0.5));
                
                // DCT8
                v = cos(PI*(k + 0.5)*(n + 0.5) / (blk_size + 0.5)) * sqrt(2.0 / (blk_size + 0.5));
                coeffs[DCT8*blk_size*blk_size + k * blk_size + n] = (s8)(s * v + (v > 0 ? 0.5 : -0.5));

                // DST7
                v = sin(PI*(k + 0.5)*(n + 1) / (blk_size + 0.5)) * sqrt(2.0 / (blk_size + 0.5));
                coeffs[DST7*blk_size*blk_size + k * blk_size + n] = (s8)(s * v + (v > 0 ? 0.5 : -0.5));

            }
        }
        
        g_tbl_itrans[DCT2][i] = coeffs;
        g_tbl_itrans[DCT8][i] = coeffs + DCT8*blk_size*blk_size;
        g_tbl_itrans[DST7][i] = coeffs + DST7*blk_size*blk_size;

        coeffs += NUM_TRANS_TYPE * blk_size*blk_size;

        blk_size <<= 1;
    }
}